

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O3

uint16_t MATROSKA_CueTrackNum(matroska_cuepoint *Cue)

{
  ebml_context *peVar1;
  bool_t bVar2;
  ebml_master *Element;
  ebml_integer *Element_00;
  int64_t iVar3;
  uint16_t uVar4;
  
  peVar1 = MATROSKA_getContextCuePoint();
  bVar2 = EBML_ElementIsType((ebml_element *)Cue,peVar1);
  if (bVar2 != 0) {
    peVar1 = MATROSKA_getContextCueTrackPositions();
    Element = (ebml_master *)EBML_MasterFindFirstElt(&Cue->Base,peVar1,0,0,0);
    uVar4 = 0xffff;
    if (Element != (ebml_master *)0x0) {
      peVar1 = MATROSKA_getContextCueTrack();
      Element_00 = (ebml_integer *)EBML_MasterFindFirstElt(Element,peVar1,0,0,0);
      if (Element_00 != (ebml_integer *)0x0) {
        iVar3 = EBML_IntegerValue(Element_00);
        uVar4 = (uint16_t)iVar3;
      }
    }
    return uVar4;
  }
  __assert_fail("EBML_ElementIsType((ebml_element*)Cue, MATROSKA_getContextCuePoint())",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                ,0x2ee,"uint16_t MATROSKA_CueTrackNum(const matroska_cuepoint *)");
}

Assistant:

uint16_t MATROSKA_CueTrackNum(const matroska_cuepoint *Cue)
{
    ebml_master *Position;
    ebml_integer *CueTrack;
    assert(EBML_ElementIsType((ebml_element*)Cue, MATROSKA_getContextCuePoint()));
    Position = (ebml_master*)EBML_MasterFindChild((ebml_master*)Cue,MATROSKA_getContextCueTrackPositions());
    if (!Position)
        return -1;
    CueTrack = (ebml_integer*)EBML_MasterFindChild(Position,MATROSKA_getContextCueTrack());
    if (!CueTrack)
        return -1;
    return (uint16_t)EBML_IntegerValue(CueTrack);
}